

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O1

void get_inter_value_from_panel_value(Am_Value *panel_value,Am_Object *panel,Am_Value *value)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object item;
  Am_Value v;
  Am_Object inter;
  Am_Value_List parts;
  Am_Value label_or_id;
  Am_Value_List inter_value_list;
  Am_Value_List panel_value_list;
  Am_Object local_90;
  Am_Value local_88;
  Am_Object local_78;
  Am_Value_List local_70;
  Am_Value local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  Am_Value_List::Am_Value_List(&local_70);
  Am_Value_List::Am_Value_List(&local_40);
  Am_Value_List::Am_Value_List(&local_50);
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  local_78.data = (Am_Object_Data *)0x0;
  local_90.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(panel,0x82,1);
  Am_Value::operator=(&local_88,pAVar3);
  bVar1 = Am_Value::Valid(&local_88);
  if (!bVar1) goto LAB_00263cae;
  Am_Value_List::operator=(&local_70,&local_88);
  Am_Value::operator=(value,0);
  bVar1 = Am_Value::Valid(panel_value);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(panel_value);
    if (!bVar1) goto LAB_00263b8d;
    bVar1 = true;
    Am_Value_List::operator=(&local_40,panel_value);
  }
  else {
LAB_00263b8d:
    bVar1 = false;
  }
  Am_Value_List::Start(&local_70);
  while( true ) {
    bVar2 = Am_Value_List::Last(&local_70);
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&local_70);
    Am_Object::operator=(&local_90,pAVar3);
    pAVar3 = Am_Object::Get(&local_90,0x1af,1);
    Am_Value::operator=(&local_60,pAVar3);
    if (bVar1) {
      Am_Value_List::Start(&local_40);
      bVar2 = Am_Value_List::Member(&local_40,&local_60);
      if (bVar2) {
        Am_Object::Set(&local_90,0x172,true,0);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
        Am_Value_List::Add(&local_50,pAVar4,Am_TAIL,true);
      }
      else {
LAB_00263c76:
        Am_Object::Set(&local_90,0x172,false,0);
      }
    }
    else {
      bVar2 = Am_Value::operator==(panel_value,&local_60);
      if (!bVar2) goto LAB_00263c76;
      Am_Object::Set(&local_90,0x172,true,0);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
      Am_Value::operator=(value,pAVar4);
    }
    Am_Value_List::Next(&local_70);
  }
  if (bVar1) {
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Value::operator=(value,pAVar4);
  }
LAB_00263cae:
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_78);
  Am_Value::~Am_Value(&local_60);
  Am_Value::~Am_Value(&local_88);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value_List::~Am_Value_List(&local_70);
  return;
}

Assistant:

void
get_inter_value_from_panel_value(const Am_Value &panel_value,
                                 const Am_Object &panel, Am_Value &value)
{
  Am_Value_List parts, panel_value_list, inter_value_list;
  Am_Value v, label_or_id;
  Am_Object inter, item;
  bool is_list = false;
  bool found_it = false;
  int panel_value_found_count = 0;
  v = panel.Peek(Am_GRAPHICAL_PARTS);
  if (!v.Valid())
    return;
  parts = v;
  value = (0L); //initialize return value
  if (panel_value.Valid() && Am_Value_List::Test(panel_value)) { // is a list
    panel_value_list = panel_value;
    is_list = true;
  }
  for (parts.Start(); !parts.Last(); parts.Next()) {
    item = parts.Get();
    label_or_id = item.Peek(Am_LABEL_OR_ID);
    if (is_list) {
      panel_value_list.Start();
      if (panel_value_list.Member(label_or_id)) { // then this one should be on
        item.Set(Am_SELECTED, true);
        inter_value_list.Add(item);
        panel_value_found_count++;
      } else // this one should be off
        item.Set(Am_SELECTED, false);
    } else { // panel value not a list, should be Am_LABEL_OR_ID
      if (panel_value == label_or_id) { // then this one should be on
        item.Set(Am_SELECTED, true);
        value = item;
        found_it = true;
      } else // this one should be off
        item.Set(Am_SELECTED, false);
    }
  } // end for parts
  if (is_list) {
    value = inter_value_list;
#if 0 //this testing doesn't work, move to a Set_Type_Check
    int unused = panel_value_list.Length() - panel_value_found_count;
    if (unused != 0) {
     std::cerr << "** Amulet WARNING: Value List " << panel_value
	   << " which was set into widget "
	   << panel << " seems to contain " << unused
	   << " item(s) that do not match one the values in its "
	   "Am_ITEMS list.\n" <<std::flush;
    }
#endif
  } else {
#if 0 // this testing doesn't work, move to a Set_Type_Check **
    if( !found_it ) {
      // unfortunately, can't raise an error because panels are often
      // initialized with illegal values temporarily
      if (panel_value.Valid())) {
     std::cerr << "** Amulet WARNING: Value " << panel_value
	   << " (type=" << Am_Get_Type_Name(panel_value.type)
	   << ") which was set into widget " << panel
	  << " seems to not be one the values in its Am_ITEMS list\n" <<std::flush;
      }
      return;  // don't remove this line!
      // gcc 2.7.0 on HP requires it (otherwise compiler bug causes a crash)
      // -- rcm
    }
#endif
    return;
  }
}